

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O0

int Gia_ManVerifyWithBoxes
              (Gia_Man_t *pGia,int nBTLimit,int nTimeLim,int fSeq,int fDumpFiles,int fVerbose,
              char *pFileSpec)

{
  int iVar1;
  int iVar2;
  char *__ptr;
  char *local_910;
  char *local_900;
  Cec_ParCec_t *pPars;
  int local_8e8;
  Cec_ParCec_t ParsCec;
  Fra_Sec_t *pSecPar;
  Fra_Sec_t SecPar;
  Aig_Man_t *pMan;
  char *pNameGeneric;
  char pFileName1 [1000];
  char local_448 [8];
  char pFileName0 [1000];
  Vec_Int_t *local_58;
  Vec_Int_t *vBoxPres;
  Gia_Man_t *pMiter;
  Gia_Man_t *pGia1;
  Gia_Man_t *pGia0;
  Gia_Man_t *pSpec;
  int Status;
  int fVerbose_local;
  int fDumpFiles_local;
  int fSeq_local;
  int nTimeLim_local;
  int nBTLimit_local;
  Gia_Man_t *pGia_local;
  
  pSpec._0_4_ = -1;
  local_58 = (Vec_Int_t *)0x0;
  pSpec._4_4_ = fVerbose;
  Status = fDumpFiles;
  fVerbose_local = fSeq;
  fDumpFiles_local = nTimeLim;
  fSeq_local = nBTLimit;
  _nTimeLim_local = pGia;
  if ((pFileSpec == (char *)0x0) && (pGia->pSpec == (char *)0x0)) {
    printf("Spec file is not given. Use standard flow.\n");
    pGia_local._4_4_ = (int)pSpec;
  }
  else {
    iVar1 = Gia_ManBoxNum(pGia);
    if ((iVar1 == 0) || (_nTimeLim_local->pAigExtra != (Gia_Man_t *)0x0)) {
      if (pFileSpec == (char *)0x0) {
        local_900 = _nTimeLim_local->pSpec;
      }
      else {
        local_900 = pFileSpec;
      }
      pGia0 = Gia_AigerRead(local_900,0,0,0);
      iVar1 = Gia_ManBoxNum(pGia0);
      if ((iVar1 == 0) || (pGia0->pAigExtra != (Gia_Man_t *)0x0)) {
        if ((_nTimeLim_local->pManTime == (void *)0x0) && (pGia0->pManTime == (void *)0x0)) {
          pGia1 = Gia_ManDup(pGia0);
          pMiter = Gia_ManDup(_nTimeLim_local);
        }
        else {
          if (((pGia0->pManTime != (void *)0x0) &&
              (iVar1 = Tim_ManBlackBoxNum((Tim_Man_t *)pGia0->pManTime), 0 < iVar1)) &&
             (iVar1 = Gia_ManBoxNum(_nTimeLim_local), 0 < iVar1)) {
            iVar1 = Gia_ManBoxNum(pGia0);
            iVar2 = Gia_ManBoxNum(_nTimeLim_local);
            if (iVar1 < iVar2) {
              printf("Spec has less boxes than the design. Cannot proceed.\n");
              return (int)pSpec;
            }
            iVar1 = Gia_ManBoxNum(pGia0);
            iVar2 = Gia_ManBoxNum(_nTimeLim_local);
            if ((iVar2 < iVar1) &&
               (local_58 = Tim_ManAlignTwo((Tim_Man_t *)pGia0->pManTime,
                                           (Tim_Man_t *)_nTimeLim_local->pManTime),
               local_58 == (Vec_Int_t *)0x0)) {
              printf("Boxes of spec and design cannot be aligned. Cannot proceed.\n");
              return (int)pSpec;
            }
          }
          iVar1 = Gia_ManBoxNum(pGia0);
          if (iVar1 < 1) {
            pGia1 = Gia_ManDup(pGia0);
          }
          else {
            pGia1 = Gia_ManDupCollapse(pGia0,pGia0->pAigExtra,local_58,fVerbose_local);
          }
          iVar1 = Gia_ManBoxNum(_nTimeLim_local);
          if (iVar1 < 1) {
            pMiter = Gia_ManDup(_nTimeLim_local);
          }
          else {
            pMiter = Gia_ManDupCollapse(_nTimeLim_local,_nTimeLim_local->pAigExtra,(Vec_Int_t *)0x0,
                                        fVerbose_local);
          }
          Vec_IntFreeP(&local_58);
        }
        if (Status != 0) {
          if (pFileSpec == (char *)0x0) {
            local_910 = _nTimeLim_local->pSpec;
          }
          else {
            local_910 = pFileSpec;
          }
          __ptr = Extra_FileNameGeneric(local_910);
          sprintf(local_448,"%s_spec.aig",__ptr);
          sprintf((char *)&pNameGeneric,"%s_impl.aig",__ptr);
          Gia_AigerWrite(pGia1,local_448,0,0,0);
          Gia_AigerWrite(pMiter,(char *)&pNameGeneric,0,0,0);
          if (__ptr != (char *)0x0) {
            free(__ptr);
          }
          printf("Dumped two parts of the miter into files \"%s\" and \"%s\".\n",local_448,
                 &pNameGeneric);
        }
        if (fVerbose_local == 0) {
          vBoxPres = (Vec_Int_t *)Gia_ManMiter(pGia1,pMiter,0,1,0,0,pSpec._4_4_);
          if ((Gia_Man_t *)vBoxPres != (Gia_Man_t *)0x0) {
            Cec_ManCecSetDefaultParams((Cec_ParCec_t *)((long)&pPars + 4));
            pPars._4_4_ = fSeq_local;
            local_8e8 = fDumpFiles_local;
            ParsCec.fSilent = pSpec._4_4_;
            pSpec._0_4_ = Cec_ManVerify((Gia_Man_t *)vBoxPres,(Cec_ParCec_t *)((long)&pPars + 4));
            if (-1 < ParsCec.fVeryVerbose) {
              Abc_Print(1,"Verification failed for at least one output (%d).\n",
                        (ulong)(uint)ParsCec.fVeryVerbose);
            }
            Gia_ManStop((Gia_Man_t *)vBoxPres);
          }
        }
        else {
          vBoxPres = (Vec_Int_t *)Gia_ManMiter(pGia1,pMiter,0,0,1,0,pSpec._4_4_);
          if ((Gia_Man_t *)vBoxPres != (Gia_Man_t *)0x0) {
            ParsCec._28_8_ = &pSecPar;
            Fra_SecSetDefaultParams((Fra_Sec_t *)ParsCec._28_8_);
            *(undefined4 *)(ParsCec._28_8_ + 0x2c) = 0;
            *(int *)(ParsCec._28_8_ + 0xc) = fSeq_local;
            *(int *)(ParsCec._28_8_ + 100) = fDumpFiles_local;
            *(int *)(ParsCec._28_8_ + 0x5c) = pSpec._4_4_;
            SecPar._112_8_ = Gia_ManToAig((Gia_Man_t *)vBoxPres,0);
            Gia_ManStop((Gia_Man_t *)vBoxPres);
            pSpec._0_4_ = Fra_FraigSec((Aig_Man_t *)SecPar._112_8_,(Fra_Sec_t *)ParsCec._28_8_,
                                       (Aig_Man_t **)0x0);
            Aig_ManStop((Aig_Man_t *)SecPar._112_8_);
          }
        }
        Gia_ManStop(pGia1);
        Gia_ManStop(pMiter);
        Gia_ManStop(pGia0);
        pGia_local._4_4_ = (int)pSpec;
      }
      else {
        Gia_ManStop(pGia0);
        printf("Spec has no box logic. Use standard flow.\n");
        pGia_local._4_4_ = (int)pSpec;
      }
    }
    else {
      printf("Design has no box logic. Use standard flow.\n");
      pGia_local._4_4_ = (int)pSpec;
    }
  }
  return pGia_local._4_4_;
}

Assistant:

int Gia_ManVerifyWithBoxes( Gia_Man_t * pGia, int nBTLimit, int nTimeLim, int fSeq, int fDumpFiles, int fVerbose, char * pFileSpec )
{
    int Status   = -1;
    Gia_Man_t * pSpec, * pGia0, * pGia1, * pMiter;
    Vec_Int_t * vBoxPres = NULL;
    if ( pFileSpec == NULL && pGia->pSpec == NULL )
    {
        printf( "Spec file is not given. Use standard flow.\n" );
        return Status;
    }
    if ( Gia_ManBoxNum(pGia) && pGia->pAigExtra == NULL )
    {
        printf( "Design has no box logic. Use standard flow.\n" );
        return Status;
    }
    // read original AIG
    pSpec = Gia_AigerRead( pFileSpec ? pFileSpec : pGia->pSpec, 0, 0, 0 );
    if ( Gia_ManBoxNum(pSpec) && pSpec->pAigExtra == NULL )
    {
        Gia_ManStop( pSpec );
        printf( "Spec has no box logic. Use standard flow.\n" );
        return Status;
    }
    // prepare miter
    if ( pGia->pManTime == NULL && pSpec->pManTime == NULL )
    {
        pGia0 = Gia_ManDup( pSpec );
        pGia1 = Gia_ManDup( pGia );
    }
    else
    {
        // if timing managers have different number of black boxes,
        // it is possible that some of the boxes are swept away
        if ( pSpec->pManTime && Tim_ManBlackBoxNum((Tim_Man_t *)pSpec->pManTime) > 0 && Gia_ManBoxNum(pGia) > 0 )
        {
            // specification cannot have fewer boxes than implementation
            if ( Gia_ManBoxNum(pSpec) < Gia_ManBoxNum(pGia) )
            {
                printf( "Spec has less boxes than the design. Cannot proceed.\n" );
                return Status;
            }
            // to align the boxes, find what boxes of pSpec are dropped in pGia
            if ( Gia_ManBoxNum(pSpec) > Gia_ManBoxNum(pGia) )
            {
                vBoxPres = Tim_ManAlignTwo( (Tim_Man_t *)pSpec->pManTime, (Tim_Man_t *)pGia->pManTime );
                if ( vBoxPres == NULL )
                {
                    printf( "Boxes of spec and design cannot be aligned. Cannot proceed.\n" );
                    return Status;
                }
            }
        }
        // collapse two designs
        if ( Gia_ManBoxNum(pSpec) > 0 )
            pGia0 = Gia_ManDupCollapse( pSpec, pSpec->pAigExtra, vBoxPres, fSeq );
        else
            pGia0 = Gia_ManDup( pSpec );
        if ( Gia_ManBoxNum(pGia) > 0 )
            pGia1 = Gia_ManDupCollapse( pGia,  pGia->pAigExtra,  NULL, fSeq  );
        else
            pGia1 = Gia_ManDup( pGia );
        Vec_IntFreeP( &vBoxPres );
    }
    if ( fDumpFiles )
    {
        char pFileName0[1000], pFileName1[1000];
        char * pNameGeneric = Extra_FileNameGeneric( pFileSpec ? pFileSpec : pGia->pSpec );
        sprintf( pFileName0, "%s_spec.aig", pNameGeneric );
        sprintf( pFileName1, "%s_impl.aig", pNameGeneric );
        Gia_AigerWrite( pGia0, pFileName0, 0, 0, 0 );
        Gia_AigerWrite( pGia1, pFileName1, 0, 0, 0 );
        ABC_FREE( pNameGeneric );
        printf( "Dumped two parts of the miter into files \"%s\" and \"%s\".\n", pFileName0, pFileName1 );
    }
    // compute the miter
    if ( fSeq )
    {
        pMiter = Gia_ManMiter( pGia0, pGia1, 0, 0, 1, 0, fVerbose );
        if ( pMiter )
        {
            Aig_Man_t * pMan;
            Fra_Sec_t SecPar, * pSecPar = &SecPar;
            Fra_SecSetDefaultParams( pSecPar );
            pSecPar->fRetimeFirst = 0;
            pSecPar->nBTLimit  = nBTLimit;
            pSecPar->TimeLimit = nTimeLim;
            pSecPar->fVerbose  = fVerbose;
            pMan = Gia_ManToAig( pMiter, 0 );
            Gia_ManStop( pMiter );
            Status = Fra_FraigSec( pMan, pSecPar, NULL );
            Aig_ManStop( pMan );
        }
    }
    else
    {
        pMiter = Gia_ManMiter( pGia0, pGia1, 0, 1, 0, 0, fVerbose );
        if ( pMiter )
        {
            Cec_ParCec_t ParsCec, * pPars = &ParsCec;
            Cec_ManCecSetDefaultParams( pPars );
            pPars->nBTLimit  = nBTLimit;
            pPars->TimeLimit = nTimeLim;
            pPars->fVerbose  = fVerbose;
            Status = Cec_ManVerify( pMiter, pPars );
            if ( pPars->iOutFail >= 0 )
                Abc_Print( 1, "Verification failed for at least one output (%d).\n", pPars->iOutFail );
            Gia_ManStop( pMiter );
        }
    }
    Gia_ManStop( pGia0 );
    Gia_ManStop( pGia1 );
    Gia_ManStop( pSpec );
    return Status;
}